

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

typed_value<std::vector<double,_std::allocator<double>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<double>
          (options_boost_po *this,
          shared_ptr<VW::config::typed_option<std::vector<double,_std::allocator<double>_>_>_> *opt)

{
  typed_option<std::vector<double,_std::allocator<double>_>_> *this_00;
  typed_value<std::vector<double,_std::allocator<double>_>,_char> *ptVar1;
  _Vector_base<double,_std::allocator<double>_> _Stack_38;
  
  ptVar1 = boost::program_options::value<std::vector<double,std::allocator<double>>>();
  this_00 = (opt->
            super___shared_ptr<VW::config::typed_option<std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if ((this_00->m_default_value).
      super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    typed_option<std::vector<double,_std::allocator<double>_>_>::default_value
              ((vector<double,_std::allocator<double>_> *)&_Stack_38,this_00);
    boost::program_options::typed_value<std::vector<double,_std::allocator<double>_>,_char>::
    default_value(ptVar1,(vector<double,_std::allocator<double>_> *)&_Stack_38);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_38);
  }
  ptVar1 = add_notifier<double>(this,opt,ptVar1);
  ptVar1->m_composing = true;
  return ptVar1;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(
    std::shared_ptr<typed_option<std::vector<T>>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value(opt->default_value());
  }

  return add_notifier(opt, value)->composing();
}